

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# fastcgi_api.cpp
# Opt level: O1

void __thiscall
cppcms::impl::cgi::fastcgi::on_read_stdin_eof_expected
          (fastcgi *this,error_code *e,io_handler *h,size_t s)

{
  error_code local_28;
  
  if (e->_M_value != 0) {
    booster::callback<void_(const_std::error_code_&,_unsigned_long)>::operator()(h,e,s);
    return;
  }
  if ((((this->header_).type == '\x05') && (this->request_id_ == (uint)(this->header_).request_id))
     && ((this->header_).content_length == 0)) {
    local_28._M_value = 0;
    local_28._M_cat = (error_category *)std::_V2::system_category();
  }
  else {
    local_28._M_value = 1;
    local_28._M_cat = (error_category *)&cppcms_category;
  }
  booster::callback<void_(const_std::error_code_&,_unsigned_long)>::operator()(h,&local_28,s);
  return;
}

Assistant:

void on_read_stdin_eof_expected(booster::system::error_code const &e,io_handler const &h,size_t s)
		{
			if(e) { h(e,s); return; }
			if(	header_.type!=fcgi_stdin 
				|| header_.request_id!=request_id_ 
				|| header_.content_length!=0)
			{
				h(booster::system::error_code(errc::protocol_violation,cppcms_category),s);
				return;
			}
			h(booster::system::error_code(),s);
		}